

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O0

int run_test_tcp_local_connect_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  sockaddr_in addr;
  
  iVar1 = is_supported_system();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","Unsupported system");
    fflush(_stderr);
    addr.sin_zero[0] = '\a';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  else {
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(long)&eval_a + 4);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
              ,0x85,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
      abort();
    }
    uVar2 = uv_default_loop();
    eval_a._0_4_ = uv_timer_init(uVar2,&timer);
    if ((long)(int)eval_a != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
              ,0x88,"r","==","0",(long)(int)eval_a,"==",0);
      abort();
    }
    eval_a._0_4_ = uv_timer_start(&timer,timer_cb,1000,0);
    if ((long)(int)eval_a != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
              ,0x8c,"r","==","0",(long)(int)eval_a,"==",0);
      abort();
    }
    uVar2 = uv_default_loop();
    eval_a._0_4_ = uv_tcp_init(uVar2,&conn);
    if ((long)(int)eval_a != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
              ,0x8f,"r","==","0",(long)(int)eval_a,"==",0);
      abort();
    }
    eval_a._0_4_ = uv_tcp_connect(&connect_req,&conn,(long)&eval_a + 4,connect_local_cb);
    if ((int)eval_a == -0x65) {
      fprintf(_stderr,"%s\n","Network unreachable.");
      fflush(_stderr);
      addr.sin_zero[0] = '\a';
      addr.sin_zero[1] = '\0';
      addr.sin_zero[2] = '\0';
      addr.sin_zero[3] = '\0';
    }
    else {
      if ((long)(int)eval_a != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                ,0x97,"r","==","0",(long)(int)eval_a,"==",0);
        abort();
      }
      uVar2 = uv_default_loop();
      eval_a._0_4_ = uv_run(uVar2,0);
      if ((long)(int)eval_a != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                ,0x9a,"r","==","0",(long)(int)eval_a,"==",0);
        abort();
      }
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                ,0x9c,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
        abort();
      }
      uv_library_shutdown();
      addr.sin_zero[0] = '\0';
      addr.sin_zero[1] = '\0';
      addr.sin_zero[2] = '\0';
      addr.sin_zero[3] = '\0';
    }
  }
  iVar1._0_1_ = addr.sin_zero[0];
  iVar1._1_1_ = addr.sin_zero[1];
  iVar1._2_1_ = addr.sin_zero[2];
  iVar1._3_1_ = addr.sin_zero[3];
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_local_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  if (!is_supported_system()) {
    RETURN_SKIP("Unsupported system");
  }
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* Give it 1s to timeout. */
  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_local_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}